

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_dec.c
# Opt level: O0

int VP8ParseIntraModeRow(VP8BitReader *br,VP8Decoder *dec)

{
  long in_RSI;
  int mb_x;
  int in_stack_00000044;
  VP8Decoder *in_stack_00000048;
  VP8BitReader *in_stack_00000050;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RSI + 0x198); local_14 = local_14 + 1) {
    ParseIntraMode(in_stack_00000050,in_stack_00000048,in_stack_00000044);
  }
  return (int)((*(int *)(in_RSI + 0x38) != 0 ^ 0xffU) & 1);
}

Assistant:

int VP8ParseIntraModeRow(VP8BitReader* const br, VP8Decoder* const dec) {
  int mb_x;
  for (mb_x = 0; mb_x < dec->mb_w; ++mb_x) {
    ParseIntraMode(br, dec, mb_x);
  }
  return !dec->br.eof;
}